

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O3

void __thiscall
cfd::CoinSelection::ApproximateBestSubset
          (CoinSelection *this,vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *utxos,
          int64_t n_total_value,int64_t n_target_value,vector<char,_std::allocator<char>_> *vf_best,
          int64_t *n_best,int iterations)

{
  pointer ppUVar1;
  CfdException *this_00;
  int iVar2;
  pointer ppUVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  vector<char,_std::allocator<char>_> vf_includes;
  value_type local_89;
  string local_88;
  long *local_60;
  int local_54;
  vector<char,_std::allocator<char>_> *local_50;
  CoinSelection *local_48;
  int64_t local_40;
  ulong local_38;
  
  local_50 = vf_best;
  local_48 = this;
  local_40 = n_target_value;
  if ((vf_best == (vector<char,_std::allocator<char>_> *)0x0) || (n_best == (int64_t *)0x0)) {
    local_88._M_dataplus._M_p = "cfd_utxo.cpp";
    local_88._M_string_length = CONCAT44(local_88._M_string_length._4_4_,0x376);
    local_88.field_2._M_allocated_capacity =
         (long)"SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset" + 0x22;
    core::logger::log<>((CfdSourceLocation *)&local_88,kCfdLogLevelWarning,
                        "Outparameter(select_value) is nullptr.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Failed to select coin. Outparameter is nullptr.","");
    core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_88);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  local_89 = '\x01';
  std::vector<char,_std::allocator<char>_>::_M_fill_assign
            (vf_best,(long)(utxos->
                           super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(utxos->
                           super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3,&local_89);
  *n_best = n_total_value;
  if (0 < iterations) {
    local_48 = (CoinSelection *)&local_48->randomize_cache_;
    iVar2 = 0;
    local_60 = n_best;
    do {
      if (*local_60 == local_40) break;
      local_89 = '\0';
      local_54 = iVar2;
      std::vector<char,_std::allocator<char>_>::_M_fill_assign
                ((vector<char,_std::allocator<char>_> *)&local_88,
                 (long)(utxos->
                       super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(utxos->
                       super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3,&local_89);
      ppUVar1 = (utxos->super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppUVar3 = (utxos->super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      bVar5 = true;
      uVar4 = 0;
      lVar7 = 0;
      do {
        local_38 = uVar4;
        if (ppUVar3 == ppUVar1) {
          bVar6 = false;
          ppUVar3 = ppUVar1;
        }
        else {
          bVar6 = false;
          uVar4 = 0;
          uVar8 = 1;
          do {
            bVar9 = local_88._M_dataplus._M_p[uVar4] == '\0';
            if (bVar5) {
              bVar9 = core::RandomNumberUtil::GetRandomBool
                                ((vector<bool,_std::allocator<bool>_> *)local_48);
            }
            if (bVar9 != false) {
              lVar7 = lVar7 + (utxos->
                              super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar4]->effective_k_value;
              local_88._M_dataplus._M_p[uVar4] = '\x01';
              if (local_40 <= lVar7) {
                if (lVar7 < *local_60) {
                  *local_60 = lVar7;
                  std::vector<char,_std::allocator<char>_>::operator=
                            (local_50,(vector<char,_std::allocator<char>_> *)&local_88);
                }
                lVar7 = lVar7 - (utxos->
                                super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar4]->effective_k_value
                ;
                local_88._M_dataplus._M_p[uVar4] = '\0';
                bVar6 = true;
              }
            }
            ppUVar1 = (utxos->
                      super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            ppUVar3 = (utxos->
                      super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar9 = uVar8 < (ulong)((long)ppUVar3 - (long)ppUVar1 >> 3);
            uVar4 = uVar8;
            uVar8 = (ulong)((int)uVar8 + 1);
          } while (bVar9);
        }
        bVar5 = false;
        uVar4 = CONCAT71((int7)(local_38 >> 8),1);
      } while ((local_38 & 1) == 0 && !bVar6);
      iVar2 = local_54 + 1;
    } while (iVar2 != iterations);
    if (local_88._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_88._M_dataplus._M_p,
                      local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void CoinSelection::ApproximateBestSubset(
    const std::vector<const Utxo*>& utxos, int64_t n_total_value,
    int64_t n_target_value, std::vector<char>* vf_best, int64_t* n_best,
    int iterations) {
  if (vf_best == nullptr || n_best == nullptr) {
    warn(CFD_LOG_SOURCE, "Outparameter(select_value) is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to select coin. Outparameter is nullptr.");
  }

  std::vector<char> vf_includes;
  vf_best->assign(utxos.size(), true);
  *n_best = n_total_value;

  for (int n_rep = 0; n_rep < iterations && *n_best != n_target_value;
       n_rep++) {
    vf_includes.assign(utxos.size(), false);
    int64_t n_total = 0;
    bool is_reached_target = false;
    for (int n_pass = 0; n_pass < 2 && !is_reached_target; n_pass++) {
      for (unsigned int i = 0; i < utxos.size(); i++) {
        // The solver here uses a randomized algorithm,
        // the randomness serves no real security purpose but is just
        // needed to prevent degenerate behavior and it is important
        // that the rng is fast. We do not use a constant random sequence,
        // because there may be some privacy improvement by making
        // the selection random.
        bool rand_bool = !vf_includes[i];
        if (n_pass == 0) {
          rand_bool = RandomNumberUtil::GetRandomBool(&randomize_cache_);
        }
        if (rand_bool) {
          // n_total += utxos[i]->amount;
          n_total += utxos[i]->effective_k_value;
          vf_includes[i] = true;
          if (n_total >= n_target_value) {
            is_reached_target = true;
            if (n_total < *n_best) {
              *n_best = n_total;
              *vf_best = vf_includes;
            }
            // n_total -= utxos[i]->amount;
            n_total -= utxos[i]->effective_k_value;
            vf_includes[i] = false;
          }
        }
      }
    }
  }
}